

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ea_dominator_tree.cpp
# Opt level: O0

void __thiscall ee_dataflow::compute_dominator_tree(ee_dataflow *this)

{
  allocator<int> *paVar1;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_00;
  int iVar2;
  value_type vVar3;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  reference piVar8;
  value_type local_270;
  value_type_conflict2 local_1cc;
  int local_1c8;
  int i_3;
  int w_1;
  int i_2;
  int u_1;
  int v_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  int u;
  int v;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int w;
  int i_1;
  anon_class_24_3_b8082bb5 eval;
  anon_class_32_4_a787555a find;
  anon_class_8_1_a815503d link;
  undefined1 *puStack_130;
  int i;
  anon_class_40_5_7c25027c dfs_dfn;
  undefined1 local_100 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dom;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> upset_minsemi;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> inset;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> fa;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> semi;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> seq;
  allocator<int> local_35;
  value_type_conflict2 local_34;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> dfn;
  int ndfn;
  ee_dataflow *this_local;
  
  dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  iVar2 = this->n_exprs;
  local_34 = -1;
  std::allocator<int>::allocator(&local_35);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,(long)iVar2,&local_34,&local_35);
  std::allocator<int>::~allocator(&local_35);
  iVar2 = this->n_exprs;
  paVar1 = (allocator<int> *)
           ((long)&semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,(long)iVar2,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = this->n_exprs;
  paVar1 = (allocator<int> *)
           ((long)&fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)iVar2,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = this->n_exprs;
  paVar1 = (allocator<int> *)
           ((long)&inset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a0,(long)iVar2,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&inset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = this->n_exprs;
  paVar1 = (allocator<int> *)
           ((long)&upset_minsemi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c0,(long)iVar2,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&upset_minsemi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = this->n_exprs;
  paVar1 = (allocator<int> *)
           ((long)&dom.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,(long)iVar2,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&dom.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = this->n_exprs;
  this_00 = (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&dfs_dfn.fa + 7);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_00);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_100,(long)iVar2,this_00);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&dfs_dfn.fa + 7));
  std::vector<int,_std::allocator<int>_>::resize(&this->idom,(long)this->n_exprs);
  puStack_130 = local_30;
  dfs_dfn.dfn = (vector<int,_std::allocator<int>_> *)
                ((long)&dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4);
  dfs_dfn.ndfn = (int *)local_60;
  dfs_dfn.this = (ee_dataflow *)local_a0;
  dfs_dfn.seq = (vector<int,_std::allocator<int>_> *)this;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)dfs_dfn.this,0);
  *pvVar6 = -1;
  compute_dominator_tree()::$_0::operator()
            (&stack0xfffffffffffffed0,0,(anon_class_40_5_7c25027c *)&stack0xfffffffffffffed0);
  for (link.inset._4_4_ = 0; link.inset._4_4_ < this->n_exprs;
      link.inset._4_4_ = link.inset._4_4_ + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)link.inset._4_4_);
    *pvVar6 = link.inset._4_4_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_c0,(long)link.inset._4_4_);
    *pvVar6 = link.inset._4_4_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_e0,(long)link.inset._4_4_);
    *pvVar6 = link.inset._4_4_;
  }
  find.upset_minsemi = (vector<int,_std::allocator<int>_> *)local_c0;
  eval.upset_minsemi = (vector<int,_std::allocator<int>_> *)local_c0;
  find.inset = (vector<int,_std::allocator<int>_> *)local_30;
  find.dfn = (vector<int,_std::allocator<int>_> *)local_80;
  find.semi = (vector<int,_std::allocator<int>_> *)local_e0;
  _w = (vector<int,_std::allocator<int>_> *)local_c0;
  eval.inset = (vector<int,_std::allocator<int>_> *)&eval.upset_minsemi;
  eval.find = (anon_class_32_4_a787555a *)local_e0;
  __range2._4_4_ =
       dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_;
  while (__range2._4_4_ = __range2._4_4_ + -1, 0 < __range2._4_4_) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_60,(long)__range2._4_4_);
    __range2._0_4_ = *pvVar6;
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->e_in,(long)(int)__range2);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
    _u = std::vector<int,_std::allocator<int>_>::end(pvVar7);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&u), bVar4) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar2 = *piVar8;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,(long)iVar2);
      if (*pvVar6 != -1) {
        iVar5 = compute_dominator_tree::anon_class_24_3_b8082bb5::operator()
                          ((anon_class_24_3_b8082bb5 *)&w,iVar2);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,(long)iVar5);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,(long)*pvVar6);
        iVar2 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,(long)(int)__range2);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,(long)*pvVar6);
        if (iVar2 < *pvVar6) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_80,(long)iVar5);
          vVar3 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_80,(long)(int)__range2);
          *pvVar6 = vVar3;
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,(long)(int)__range2);
    compute_dominator_tree::anon_class_8_1_a815503d::operator()
              ((anon_class_8_1_a815503d *)&find.upset_minsemi,*pvVar6,(int)__range2);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)(int)__range2);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_100,(long)*pvVar6);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar7,(value_type_conflict2 *)&__range2);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,(long)(int)__range2);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_100,(long)*pvVar6);
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
    _u_1 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &u_1), bVar4) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_1);
      i_2 = *piVar8;
      w_1 = compute_dominator_tree::anon_class_24_3_b8082bb5::operator()
                      ((anon_class_24_3_b8082bb5 *)&w,i_2);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_80,(long)w_1);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,(long)*pvVar6);
      iVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_80,(long)i_2);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,(long)*pvVar6);
      if (iVar2 < *pvVar6) {
        local_270 = w_1;
      }
      else {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a0,(long)(int)__range2);
        local_270 = *pvVar6;
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,(long)i_2);
      *pvVar6 = local_270;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,(long)(int)__range2);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_100,(long)*pvVar6);
    std::vector<int,_std::allocator<int>_>::clear(pvVar7);
  }
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,0);
  *pvVar6 = -1;
  for (i_3 = 1; i_3 < dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_; i_3 = i_3 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_60,(long)i_3);
    local_1c8 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,(long)local_1c8);
    iVar2 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)local_1c8);
    if (iVar2 != *pvVar6) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,(long)local_1c8);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,(long)*pvVar6);
      vVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,(long)local_1c8);
      *pvVar6 = vVar3;
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->doms,(long)this->n_exprs);
  for (local_1cc = 1; local_1cc < this->n_exprs; local_1cc = local_1cc + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)local_1cc);
    if (*pvVar6 == -1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,(long)local_1cc);
      *pvVar6 = -1;
    }
    else {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->idom,(long)local_1cc);
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->doms,(long)*pvVar6);
      std::vector<int,_std::allocator<int>_>::push_back(pvVar7,&local_1cc);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_100);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void ee_dataflow::compute_dominator_tree() {
  int ndfn = 0;
  std::vector<int> dfn(n_exprs, -1), seq(n_exprs), semi(n_exprs), fa(n_exprs), inset(n_exprs), upset_minsemi(n_exprs);
  std::vector<std::vector<int>> dom(n_exprs);
  idom.resize(n_exprs);

  // compute dfs sequence
  const auto dfs_dfn = [&] (int u, auto &&dfs_dfn) -> void {
    dfn[u] = ndfn++;
    seq[dfn[u]] = u;
    for(int v: e_out[u]) if(dfn[v] == -1) {
        fa[v] = u;
        dfs_dfn(v, dfs_dfn);
      }
  };
  fa[0] = -1;
  dfs_dfn(0, dfs_dfn);

  // compute semi dominator
  for(int i = 0; i < n_exprs; ++i) {
    semi[i] = i;
    inset[i] = i;
    upset_minsemi[i] = i;
  }
  const auto link = [&] (int v, int w) {
    assert(inset[w] == w);
    inset[w] = v;
  };
  const auto find = [&] (int v, auto &&find) {
    if(inset[v] == v) return v;
    int p = find(inset[v], find);
    if(dfn[semi[upset_minsemi[p]]] < dfn[semi[upset_minsemi[v]]])
      upset_minsemi[v] = upset_minsemi[p];
    return inset[v] = p;
  };
  const auto eval = [&] (int v) {
    if(inset[v] == v) return v;
    else {
      find(v, find);
      return upset_minsemi[v];
    }
  };
  
  for(int i = ndfn - 1; i >= 1; --i) {
    int w = seq[i];
    for(int v: e_in[w]) {
      if(dfn[v] == -1) continue;
      int u = eval(v);
      if(dfn[semi[u]] < dfn[semi[w]]) semi[w] = semi[u];
    }
    link(fa[w], w);
    dom[semi[w]].push_back(w);
    for(int v: dom[fa[w]]) {
      int u = eval(v);
      idom[v] = (dfn[semi[u]] < dfn[semi[v]]) ? u : fa[w];
    }
    dom[fa[w]].clear();
  }

  // finalize immediate dominator
  idom[0] = -1;
  for(int i = 1; i < ndfn; ++i) {
    int w = seq[i];
    if(idom[w] != semi[w]) idom[w] = idom[idom[w]];
  }
  doms.resize(n_exprs);
  for(int i = 1; i < n_exprs; ++i) {
    if(dfn[i] == -1) idom[i] = -1;
    else doms[idom[i]].push_back(i);
  }
}